

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

void __thiscall tinyusdz::usda::USDAReader::Impl::RegisterPrimSpecHandler(Impl *this)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._8_8_ = 0;
  pcStack_10 = ::std::_Function_handler<$e61d4a7e$>::_M_invoke;
  local_18 = ::std::_Function_handler<$e61d4a7e$>::_M_manager;
  local_28._M_unused._M_object = this;
  ::std::function<$3792144$>::operator=
            (&(this->_parser)._primspec_fun,(function<_3792144_> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

inline bool hasOutputs(const std::string &str) {
  return startsWith(str, "outputs:");
}